

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_comparator_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::
DefaultFieldComparatorTest_FloatingPointComparisonApproximate_Test::
~DefaultFieldComparatorTest_FloatingPointComparisonApproximate_Test
          (DefaultFieldComparatorTest_FloatingPointComparisonApproximate_Test *this)

{
  (this->super_DefaultFieldComparatorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DefaultFieldComparatorTest_0194cb18;
  proto2_unittest::TestAllTypes::~TestAllTypes(&(this->super_DefaultFieldComparatorTest).message_2_)
  ;
  proto2_unittest::TestAllTypes::~TestAllTypes(&(this->super_DefaultFieldComparatorTest).message_1_)
  ;
  SimpleFieldComparator::~SimpleFieldComparator
            (&(this->super_DefaultFieldComparatorTest).comparator_.super_SimpleFieldComparator);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x6d8);
  return;
}

Assistant:

TEST_F(DefaultFieldComparatorTest, FloatingPointComparisonApproximate) {
  const FieldDescriptor* field_float =
      descriptor_->FindFieldByName("optional_float");
  const FieldDescriptor* field_double =
      descriptor_->FindFieldByName("optional_double");

  message_1_.set_optional_float(2.300005f);
  message_2_.set_optional_float(2.300006f);
  message_1_.set_optional_double(2.3000000000000003);
  message_2_.set_optional_double(2.3000000000000007);

  // Approximate comparison depends on MathUtil, so we assert on MathUtil
  // results first to check if that's where the failure was introduced.
  ASSERT_NE(message_1_.optional_float(), message_2_.optional_float());
  ASSERT_NE(message_1_.optional_double(), message_2_.optional_double());
  ASSERT_FLOAT_EQ(message_1_.optional_float(), message_2_.optional_float());
  ASSERT_DOUBLE_EQ(message_1_.optional_double(), message_2_.optional_double());

  // DefaultFieldComparator's default float comparison mode is EXACT.
  ASSERT_EQ(DefaultFieldComparator::EXACT, comparator_.float_comparison());
  EXPECT_EQ(FieldComparator::DIFFERENT,
            comparator_.Compare(message_1_, message_2_, field_float, -1, -1,
                                nullptr));
  EXPECT_EQ(FieldComparator::DIFFERENT,
            comparator_.Compare(message_1_, message_2_, field_double, -1, -1,
                                nullptr));

  comparator_.set_float_comparison(DefaultFieldComparator::APPROXIMATE);

  EXPECT_EQ(FieldComparator::SAME,
            comparator_.Compare(message_1_, message_2_, field_float, -1, -1,
                                nullptr));
  EXPECT_EQ(FieldComparator::SAME,
            comparator_.Compare(message_1_, message_2_, field_double, -1, -1,
                                nullptr));
}